

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLeSample> * __thiscall
pbrt::SpotLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,SpotLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  float fVar1;
  uintptr_t uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  long lVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined8 in_XMM0_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [56];
  undefined1 auVar27 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar28 [64];
  undefined1 auVar30 [56];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float n2;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  Vector3f wl;
  SampledSpectrum SVar39;
  Float p [2];
  Point3fi o;
  float local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_a0 [2];
  undefined1 local_98 [16];
  float local_80;
  Float local_7c;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_6c;
  float local_64;
  Point3fi local_58;
  Point3fi local_38;
  undefined1 auVar29 [64];
  
  auVar28._8_56_ = in_register_00001248;
  auVar28._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
  local_c8._8_8_ = in_XMM0_Qb;
  local_c8._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  auVar3 = local_c8;
  lVar13 = 0;
  local_a0[0] = 1.0 - this->cosFalloffStart;
  local_a0[1] = (this->cosFalloffStart - this->cosFalloffEnd) * 0.5;
  local_dc = local_a0[0] + local_a0[1];
  do {
    if (auVar28._0_4_ < local_a0[lVar13] / local_dc) goto LAB_002de1be;
    auVar28 = ZEXT464((uint)(auVar28._0_4_ - local_a0[lVar13] / local_dc));
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  lVar13 = 2;
LAB_002de1be:
  local_7c = time;
  if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
     (iVar12 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg
                                  ), iVar12 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
               SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
               {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x208) = *(long *)(in_FS_OFFSET + -0x208) + 1;
  local_c8._0_4_ = u1.super_Tuple2<pbrt::Point2,_float>.x;
  if (lVar13 == 2) {
    *(long *)(in_FS_OFFSET + -0x210) = *(long *)(in_FS_OFFSET + -0x210) + 1;
    local_dc = local_a0[1] / local_dc;
  }
  else {
    local_dc = local_a0[(int)lVar13] / local_dc;
    if ((int)lVar13 == 0) {
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(1.0 - (float)local_c8._0_4_)),auVar3,
                                ZEXT416((uint)this->cosFalloffStart));
      fVar23 = auVar14._0_4_;
      auVar14 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar23 * fVar23)),ZEXT816(0) << 0x40);
      auVar3 = vmovshdup_avx(auVar3);
      local_98._0_4_ = (auVar3._0_4_ + auVar3._0_4_) * 3.1415927;
      auVar3 = vsqrtss_avx(auVar14,auVar14);
      auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar3);
      fVar24 = cosf((float)local_98._0_4_);
      fVar21 = sinf((float)local_98._0_4_);
      auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar23));
      auVar3 = vinsertps_avx(ZEXT416((uint)(fVar24 * auVar3._0_4_)),
                             ZEXT416((uint)(fVar21 * auVar3._0_4_)),0x10);
      uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar23),SUB6416(ZEXT464(0xbf800000),0),1);
      bVar6 = (bool)((byte)uVar4 & 1);
      local_d8._4_12_ = auVar14._4_12_;
      local_d8._0_4_ = (uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar14._0_4_;
      local_dc = (1.0 / ((1.0 - this->cosFalloffStart) * 6.2831855)) * local_dc;
      goto LAB_002de533;
    }
  }
  fVar23 = this->cosFalloffEnd;
  auVar28 = ZEXT464((uint)fVar23);
  fVar24 = this->cosFalloffStart;
  fVar22 = fVar24 - fVar23;
  fVar33 = (fVar23 - fVar23) / fVar22;
  fVar21 = fVar33 * fVar33;
  auVar14 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar21 * fVar21)),ZEXT416(0x40000000),
                                ZEXT416((uint)(fVar33 * fVar21)));
  fVar21 = auVar14._0_4_ - (float)local_c8._0_4_;
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(ZEXT416((uint)fVar21),auVar15);
  auVar20 = ZEXT416((uint)fVar23);
  auVar14 = auVar20;
  if (1e-06 <= auVar15._0_4_) {
    fVar34 = fVar22 / fVar22;
    fVar33 = fVar34 * fVar34;
    auVar14 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416(0x40000000),
                                  ZEXT416((uint)(fVar34 * fVar33)));
    fVar33 = auVar14._0_4_ - (float)local_c8._0_4_;
    auVar17._8_4_ = 0x7fffffff;
    auVar17._0_8_ = 0x7fffffff7fffffff;
    auVar17._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx512vl(ZEXT416((uint)fVar33),auVar17);
    fVar34 = auVar14._0_4_;
    auVar15 = ZEXT416((uint)fVar24);
    auVar14 = auVar15;
    if (1e-06 <= fVar34) {
      auVar16 = ZEXT816(0) << 0x20;
      uVar4 = vcmpps_avx512vl(ZEXT416((uint)fVar21),auVar16,1);
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar37 = ZEXT464((uint)(fVar23 - (fVar22 * fVar21) / (fVar33 - fVar21)));
      auVar17 = vdivss_avx512f(ZEXT416(0x40000000),ZEXT416((uint)fVar22));
      auVar19 = auVar15;
      while( true ) {
        fVar21 = auVar19._0_4_;
        uVar5 = vcmpss_avx512f(auVar37._0_16_,auVar19,1);
        bVar6 = (bool)((byte)uVar5 & 1);
        auVar14 = vmulss_avx512f(ZEXT416((uint)(fVar21 + auVar20._0_4_)),
                                 SUB6416(ZEXT464(0x3f000000),0));
        uVar5 = vcmpss_avx512f(auVar20,auVar37._0_16_,1);
        bVar7 = (bool)((byte)uVar5 & 1);
        auVar14._0_4_ =
             (uint)bVar7 * ((uint)bVar6 * auVar37._0_4_ + (uint)!bVar6 * auVar14._0_4_) +
             (uint)!bVar7 * auVar14._0_4_;
        auVar18 = vsubss_avx512f(auVar14,auVar28._0_16_);
        auVar19 = vucomiss_avx512f(auVar14);
        auVar28 = ZEXT1664(auVar19);
        auVar38._0_4_ = auVar18._0_4_ / fVar22;
        auVar38._4_12_ = auVar18._4_12_;
        fVar23 = 0.0;
        if ((1e-06 <= fVar34) && (auVar14 = vucomiss_avx512f(auVar15), 1e-06 <= fVar34)) {
          fVar23 = 1.0;
          if ((auVar19._0_4_ != fVar24) || (NAN(auVar19._0_4_) || NAN(fVar24))) {
            uVar5 = vcmpss_avx512f(auVar38,auVar16,1);
            auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar38);
            fVar23 = (float)((uint)!(bool)((byte)uVar5 & 1) * auVar19._0_4_);
            auVar18._4_12_ = auVar19._4_12_;
            auVar18._0_4_ = fVar23;
            auVar19 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar18,
                                      SUB6416(ZEXT464(0x40400000),0));
            fVar23 = fVar23 * fVar23 * auVar19._0_4_;
          }
          fVar23 = fVar23 * auVar17._0_4_;
        }
        fVar33 = auVar38._0_4_ * auVar38._0_4_;
        auVar19 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar33 * fVar33)),
                                      ZEXT416((uint)(auVar38._0_4_ * fVar33)),ZEXT416(0x40000000));
        fVar33 = auVar19._0_4_ - (float)local_c8._0_4_;
        auVar19 = vandps_avx(ZEXT416((uint)fVar33),auVar36);
        if (auVar19._0_4_ < 1e-06) break;
        uVar5 = vcmpps_avx512vl(ZEXT416((uint)fVar33),auVar16,5);
        bVar8 = (byte)uVar4 ^ (byte)uVar5;
        auVar19._4_12_ = auVar14._4_12_;
        auVar19._0_4_ =
             (float)((uint)(bVar8 & 1) * (int)fVar21 + (uint)!(bool)(bVar8 & 1) * auVar14._0_4_);
        auVar20._0_4_ =
             (float)((uint)(bVar8 & 1) * auVar14._0_4_ +
                    (uint)!(bool)(bVar8 & 1) * (int)auVar20._0_4_);
        fVar34 = auVar19._0_4_ - auVar20._0_4_;
        if (fVar34 < 1e-06) break;
        auVar14 = vsubss_avx512f(auVar14,ZEXT416((uint)(fVar33 / fVar23)));
        auVar37 = ZEXT1664(auVar14);
      }
    }
  }
  auVar15 = vfnmadd213ss_avx512f(auVar14,auVar14,SUB6416(ZEXT464(0x3f800000),0));
  auVar15 = vmaxss_avx(auVar15,ZEXT816(0) << 0x40);
  auVar3 = vmovshdup_avx(auVar3);
  auVar15 = vsqrtss_avx(auVar15,auVar15);
  local_98._0_4_ = (auVar3._0_4_ + auVar3._0_4_) * 3.1415927;
  auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
  fVar21 = cosf((float)local_98._0_4_);
  fVar22 = sinf((float)local_98._0_4_);
  fVar24 = 1.0;
  auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
  uVar4 = vcmpss_avx512f(auVar14,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar6 = (bool)((byte)uVar4 & 1);
  local_d8._4_12_ = auVar15._4_12_;
  local_d8._0_4_ = (uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar15._0_4_;
  fVar23 = this->cosFalloffEnd;
  fVar33 = auVar14._0_4_;
  if (fVar33 < fVar23) {
    fVar34 = 0.0;
  }
  else {
    fVar1 = this->cosFalloffStart;
    fVar34 = 0.0;
    if (fVar33 <= fVar1) {
      if ((fVar23 != fVar1) || (NAN(fVar23) || NAN(fVar1))) {
        auVar35._0_12_ = ZEXT812(0);
        auVar35._12_4_ = 0;
        auVar31._0_4_ = (fVar33 - fVar23) / (fVar1 - fVar23);
        auVar31._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar31);
        uVar4 = vcmpss_avx512f(auVar31,auVar35,1);
        fVar24 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar14._0_4_);
        auVar16._4_12_ = auVar14._4_12_;
        auVar16._0_4_ = fVar24;
        auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar16,ZEXT416(0x40400000));
        fVar24 = fVar24 * fVar24 * auVar14._0_4_;
      }
      fVar34 = (2.0 / (fVar1 - fVar23)) * fVar24;
    }
  }
  local_dc = (fVar34 * local_dc) / 6.2831855;
  auVar3 = vinsertps_avx(ZEXT416((uint)(fVar21 * auVar3._0_4_)),
                         ZEXT416((uint)(fVar22 * auVar3._0_4_)),0x10);
LAB_002de533:
  uVar2 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_78 = 0;
  local_70 = 0;
  uVar4 = vmovlps_avx(auVar3);
  local_64 = (float)local_d8._0_4_;
  local_6c._0_4_ = (uint)uVar4;
  uVar11 = (uint)local_6c;
  local_38.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(ZEXT816(0),ZEXT816(0));
  local_38.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(ZEXT816(0));
  local_6c._4_4_ = (float)((ulong)uVar4 >> 0x20);
  fVar23 = local_6c._4_4_;
  local_6c = uVar4;
  Transform::operator()(&local_58,&(this->super_LightBase).renderFromLight,&local_38);
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (this->super_LightBase).renderFromLight.m.m[0][1]
                                         )),ZEXT416(uVar11),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (this->super_LightBase).renderFromLight.m.m[1]
                                                    [1])),ZEXT416(uVar11),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * (this->super_LightBase).renderFromLight.m.m[2]
                                                    [1])),ZEXT416(uVar11),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  local_98 = vfmadd231ss_fma(auVar14,local_d8,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  auVar3 = vfmadd231ss_fma(auVar3,local_d8,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  auVar14 = vfmadd231ss_fma(auVar15,local_d8,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  fVar21 = auVar3._0_4_;
  fVar22 = local_98._0_4_;
  fVar24 = auVar14._0_4_;
  fVar23 = fVar21 * fVar21 + fVar22 * fVar22 + fVar24 * fVar24;
  auVar27._0_12_ = ZEXT812(0);
  auVar27._12_4_ = 0;
  if (0.0 < fVar23) {
    auVar32._8_4_ = 0x7fffffff;
    auVar32._0_8_ = 0x7fffffff7fffffff;
    auVar32._12_4_ = 0x7fffffff;
    auVar15 = vandps_avx(local_98,auVar32);
    auVar20 = vandps_avx(auVar3,auVar32);
    auVar14 = vandps_avx(auVar14,auVar32);
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * 0.0)),auVar27,auVar20);
    auVar14 = vfmadd231ss_fma(auVar15,auVar27,auVar14);
    fVar23 = auVar14._0_4_ / fVar23;
    auVar14 = vinsertps_avx(ZEXT416((uint)(fVar21 * fVar23)),ZEXT416((uint)(fVar22 * fVar23)),0x10);
    uVar4 = vmovlps_avx(auVar14);
    local_38.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
         fVar24 * fVar23;
    local_38.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
         (Float)(int)uVar4;
    local_38.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
         (Float)(int)((ulong)uVar4 >> 0x20);
    Point3fi::operator+=(&local_58,(Vector3<float> *)&local_38);
  }
  auVar3 = vinsertps_avx(auVar3,local_98,0x10);
  auVar10._4_4_ =
       local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar10._8_4_ =
       local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar10._0_4_ =
       local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar10._12_4_ =
       local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar14 = vinsertps_avx(auVar10,ZEXT416((uint)local_58.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar25._0_4_ =
       local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
       auVar14._0_4_;
  auVar25._4_4_ =
       local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar14._4_4_;
  auVar25._8_4_ = auVar14._8_4_ + 0.0;
  auVar25._12_4_ = auVar14._12_4_ + 0.0;
  auVar9._8_4_ = 0x3f000000;
  auVar9._0_8_ = 0x3f0000003f000000;
  auVar9._12_4_ = 0x3f000000;
  local_98 = vmulps_avx512vl(auVar25,auVar9);
  local_80 = (local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
             + local_58.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               high) * 0.5;
  wl.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  wl.super_Tuple3<pbrt::Vector3,_float>.x = local_80;
  wl.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_d8._0_4_;
  auVar30 = ZEXT856((ulong)local_d8._8_8_);
  auVar26 = (undefined1  [56])0x0;
  SVar39 = I(this,wl,lambda);
  auVar29._0_8_ = SVar39.values.values._8_8_;
  auVar29._8_56_ = auVar30;
  auVar37._0_8_ = SVar39.values.values._0_8_;
  auVar37._8_56_ = auVar26;
  auVar14 = vmovlhps_avx(auVar37._0_16_,auVar29._0_16_);
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar14;
  uVar4 = vmovlps_avx(local_98);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar4;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_80;
  uVar4 = vmovlps_avx(auVar3);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar4;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = fVar24;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_7c;
  *(uintptr_t *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0x3f800000;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x94) = local_dc;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> SpotLight::SampleLe(Point2f u1, Point2f u2,
                                                  SampledWavelengths &lambda,
                                                  Float time) const {
    // Choose whether to sample spotlight center cone or falloff region
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    Float sectionPDF;
    int section = SampleDiscrete(p, u2[0], &sectionPDF);

    Vector3f wl;
    Float pdfDir;
    if (section == 0) {
        // Sample spotlight center cone
        wl = SampleUniformCone(u1, cosFalloffStart);
        pdfDir = UniformConePDF(cosFalloffStart) * sectionPDF;

    } else {
        // Sample spotlight falloff region
        Float cosTheta = SampleSmoothStep(u1[0], cosFalloffEnd, cosFalloffStart);
        DCHECK(cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart);
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
        Float phi = u1[1] * 2 * Pi;
        wl = SphericalDirection(sinTheta, cosTheta, phi);
        pdfDir = SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) * sectionPDF /
                 (2 * Pi);
    }
    // Return sampled spotlight ray
    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(I(wl, lambda), ray, 1, pdfDir);
}